

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

WordType llvm::APInt::tcAddPart(WordType *dst,WordType src,uint parts)

{
  uint local_28;
  uint i;
  uint parts_local;
  WordType src_local;
  WordType *dst_local;
  
  local_28 = 0;
  _i = src;
  while( true ) {
    if (parts <= local_28) {
      return 1;
    }
    dst[local_28] = _i + dst[local_28];
    if (_i <= dst[local_28]) break;
    _i = 1;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

APInt::WordType APInt::tcAddPart(WordType *dst, WordType src,
                                 unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    dst[i] += src;
    if (dst[i] >= src)
      return 0; // No need to carry so exit early.
    src = 1; // Carry one to next digit.
  }

  return 1;
}